

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<wchar_t> *f)

{
  size_t sVar1;
  byte bVar2;
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar3;
  wchar_t *pwVar4;
  ulong n;
  ulong uVar5;
  char_type fill;
  wchar_t local_2c;
  
  n = (ulong)(uint)specs->width;
  sVar1 = f->size_;
  uVar5 = n - sVar1;
  if (n < sVar1 || uVar5 == 0) {
    pwVar3 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,sVar1);
    if (f->size_ != 0) {
      memmove(pwVar3,f->s,f->size_ << 2);
      return;
    }
  }
  else {
    pwVar3 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,n);
    local_2c = (specs->fill).data_[0];
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      pwVar4 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar3,uVar5 >> 1,&local_2c);
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pwVar4,f->s,sVar1 * 4);
      }
      pwVar3 = pwVar4 + sVar1;
      uVar5 = uVar5 - (uVar5 >> 1);
    }
    else {
      if (bVar2 == 2) {
        pwVar4 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar3,uVar5,&local_2c);
        if (f->size_ == 0) {
          return;
        }
        memmove(pwVar4,f->s,f->size_ << 2);
        return;
      }
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pwVar3,f->s,sVar1 * 4);
      }
      pwVar3 = pwVar3 + sVar1;
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar3,uVar5,&local_2c);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }